

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O2

int hash_iter(HashTable *table,void *key,void **_value,void **iter)

{
  uint32 uVar1;
  int iVar2;
  void *pvVar3;
  HashItem *pHVar4;
  HashItem **ppHVar5;
  
  pHVar4 = (HashItem *)*iter;
  if (pHVar4 != (HashItem *)0x0) goto LAB_0011ae9a;
  ppHVar5 = table->table;
  uVar1 = (*table->hash)(key,table->data);
  ppHVar5 = ppHVar5 + (table->table_len - 1 & uVar1);
  do {
    pHVar4 = *ppHVar5;
    if (pHVar4 == (HashItem *)0x0) {
      pvVar3 = (void *)0x0;
      iVar2 = 0;
LAB_0011aec9:
      *_value = pvVar3;
      *iter = pHVar4;
      return iVar2;
    }
    iVar2 = (*table->keymatch)(key,pHVar4->key,table->data);
    if (iVar2 != 0) {
      pvVar3 = pHVar4->value;
      iVar2 = 1;
      goto LAB_0011aec9;
    }
LAB_0011ae9a:
    ppHVar5 = &pHVar4->next;
  } while( true );
}

Assistant:

int hash_iter(const HashTable *table, const void *key,
              const void **_value, void **iter)
{
    HashItem *item = (HashItem *) *iter;
    if (item == NULL)
        item = table->table[calc_hash(table, key)];
    else
        item = item->next;

    while (item != NULL)
    {
        if (table->keymatch(key, item->key, table->data))
        {
            *_value = item->value;
            *iter = item;
            return 1;
        } // if
        item = item->next;
    } // while

    // no more matches.
    *_value = NULL;
    *iter = NULL;
    return 0;
}